

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

int PAL_wmemcmp(char16_t *string1,char16_t *string2,size_t count)

{
  ulong uVar1;
  ulong uVar2;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (string1 != string2) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (count <= uVar2 + 4) break;
      uVar1 = uVar2 + 4;
    } while (*(long *)(string1 + uVar2) == *(long *)(string2 + uVar2));
    for (; uVar2 < count; uVar2 = uVar2 + 1) {
      if ((uint)(ushort)string1[uVar2] - (uint)(ushort)string2[uVar2] != 0) {
        return (uint)(ushort)string1[uVar2] - (uint)(ushort)string2[uVar2];
      }
    }
  }
  return 0;
}

Assistant:

int
__cdecl
PAL_wmemcmp(
        const char16_t *string1,
        const char16_t *string2,
        size_t count)
{
    size_t i, wi = 0;
    int diff = 0;

    PERF_ENTRY(wmemcmp);
    ENTRY("wmemcmp (string1=%p (%S), string2=%p (%S) count=%lu)\n",
          string1?string1:W16_NULLSTRING,
          string1?string1:W16_NULLSTRING, string2?string2:W16_NULLSTRING, string2?string2:W16_NULLSTRING,
          (unsigned long) count);

    if (string1 == string2) return diff;

    constexpr size_t blockSize = sizeof(size_t) / sizeof(char16_t);
    const     size_t *num1     = (const size_t*)(string1);
    const     size_t *num2     = (const size_t*)(string2);

    while( (count > blockSize * (wi + 1)) && num1[wi] == num2[wi] ) ++wi;

    for (i = blockSize * wi; i < count; ++i)
    {
        diff = string1[i] - string2[i];
        if (diff != 0)
        {
            break;
        }
    }

    LOGEXIT("wmemcmp returning int %d\n", diff);
    PERF_EXIT(wmemcmp);
    return diff;
}